

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall
helics::CommonCore::setGlobal(CommonCore *this,string_view valueName,string_view value)

{
  ActionMessage querycmd;
  basic_string_view<char,_std::char_traits<char>_> local_f0;
  ActionMessage local_e0;
  
  local_f0._M_str = valueName._M_str;
  local_f0._M_len = valueName._M_len;
  ActionMessage::ActionMessage(&local_e0,cmd_set_global);
  local_e0.dest_id.gid = 1;
  local_e0.source_id.gid = -0x396fe;
  SmallBuffer::operator=(&local_e0.payload,&local_f0);
  ActionMessage::setStringData(&local_e0,value);
  BrokerBase::addActionMessage(&this->super_BrokerBase,&local_e0);
  ActionMessage::~ActionMessage(&local_e0);
  return;
}

Assistant:

void CommonCore::setGlobal(std::string_view valueName, std::string_view value)
{
    ActionMessage querycmd(CMD_SET_GLOBAL);
    querycmd.dest_id = gRootBrokerID;
    querycmd.source_id = gDirectCoreId;
    querycmd.payload = valueName;
    querycmd.setStringData(value);
    addActionMessage(std::move(querycmd));
}